

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_generator_serialize(secp256k1_context *ctx,uchar *output,secp256k1_generator *gen)

{
  int iVar1;
  long in_RDX;
  byte *in_RSI;
  secp256k1_ge ge;
  secp256k1_generator *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_fe *in_stack_ffffffffffffffb0;
  int local_4;
  
  if (in_RSI == (byte *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    secp256k1_generator_load(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    iVar1 = secp256k1_fe_is_quad_var(in_stack_ffffffffffffffb0);
    *in_RSI = (byte)iVar1 ^ 0xb;
    secp256k1_fe_normalize_var((secp256k1_fe *)&stack0xffffffffffffff88);
    secp256k1_fe_get_b32(in_RSI + 1,(secp256k1_fe *)&stack0xffffffffffffff88);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_generator_serialize(const secp256k1_context* ctx, unsigned char *output, const secp256k1_generator* gen) {
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(gen != NULL);

    secp256k1_generator_load(&ge, gen);

    output[0] = 11 ^ secp256k1_fe_is_quad_var(&ge.y);
    secp256k1_fe_normalize_var(&ge.x);
    secp256k1_fe_get_b32(&output[1], &ge.x);
    return 1;
}